

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

int __thiscall
Player::executeFortify(Player *this,Country *fromCountry,Country *countryToFortify,int numArmies)

{
  ostream *poVar1;
  string sStack_68;
  string local_48;
  
  *fromCountry->pNumberOfTroops = *fromCountry->pNumberOfTroops - numArmies;
  *countryToFortify->pNumberOfTroops = *countryToFortify->pNumberOfTroops + numArmies;
  poVar1 = std::operator<<((ostream *)&std::cout,"\nPlayer ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*this->pPlayerId);
  poVar1 = std::operator<<(poVar1," has fortified ");
  Map::Country::getCountryName_abi_cxx11_(&local_48,countryToFortify);
  poVar1 = std::operator<<(poVar1,(string *)&local_48);
  poVar1 = std::operator<<(poVar1," from ");
  Map::Country::getCountryName_abi_cxx11_(&sStack_68,fromCountry);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_68);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  (*this->strategy->_vptr_PlayerStrategy[5])();
  return 1;
}

Assistant:

int Player::executeFortify(Map::Country &fromCountry, Map::Country &countryToFortify, int numArmies) {
    /*
     * Act of moving armies between this player's owned countries.
     * fromCountry and countryToFortify have to be owned by this player and adjacent to each other.
     */

    fromCountry.setNumberOfTroops(fromCountry.getNumberOfTroops() - numArmies);
    countryToFortify.setNumberOfTroops(countryToFortify.getNumberOfTroops() + numArmies);
    std::cout << "\nPlayer " << this->getPlayerId() << " has fortified " << countryToFortify.getCountryName()
              << " from "
              << fromCountry.getCountryName() << std::endl;
    this->strategy->resetChoices();
    return PlayerAction::SUCCEEDED;
}